

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket_location_handler.c
# Opt level: O0

void test_ws_location_http_versions(void)

{
  cio_http_cb_return cVar1;
  size_t extraout_RDX;
  char *actual;
  undefined1 local_958 [4];
  cio_http_cb_return cb_ret;
  cio_http_client client;
  undefined1 local_580 [4];
  cio_error err;
  cio_websocket_location_handler handler;
  int iStack_30;
  upgrade_test test;
  uint i;
  upgrade_test tests [4];
  
  stack0xffffffffffffffd8 = 0x100010001;
  test.major = 0;
  test.minor = 0;
  for (; (uint)test._0_4_ < 4; test._0_4_ = test._0_4_ + 1) {
    unique0x00012000 = *(undefined8 *)&(&test)[(uint)test._0_4_].expected_ret_val;
    client.buffer_size._4_4_ =
         cio_websocket_location_handler_init
                   ((cio_websocket_location_handler *)local_580,(char **)0x0,0,on_connect,
                    fake_handler_free);
    UnityAssertEqualNumber
              (0,(long)client.buffer_size._4_4_,"web socket handler initialization failed!",0x9f,
               UNITY_DISPLAY_STYLE_INT);
    handler.websocket.ws_private.read_handler_context = local_958;
    client._232_8_ = local_580;
    client.write_response = fake_add_response_header;
    client.close = fake_write_response;
    client.parser.content_length._4_4_ =
         client.parser.content_length._4_4_ & 0x7fffffff | 0x80000000;
    client.content_length._0_4_ = 1;
    client.rb.fetch_ptr._0_2_ = handler.websocket.on_control._4_2_;
    client.rb.fetch_ptr._2_2_ = handler.websocket.on_control._6_2_;
    cVar1 = (*handler.http_location.on_fragment)
                      ((cio_http_client *)handler.websocket.ws_private.read_handler_context,
                       "Sec-WebSocket-Version",0x15);
    UnityAssertEqualNumber
              (0,(long)cVar1,"on_header_field returned wrong value for sec_ws_version_field",0xb0,
               UNITY_DISPLAY_STYLE_INT);
    cVar1 = (*handler.http_location.on_header_field_name)
                      ((cio_http_client *)handler.websocket.ws_private.read_handler_context,"13",2);
    UnityAssertEqualNumber
              (0,(long)cVar1,"on_header_value returned wrong value for sec_ws_version_value",0xb2,
               UNITY_DISPLAY_STYLE_INT);
    cVar1 = (*handler.http_location.on_fragment)
                      ((cio_http_client *)handler.websocket.ws_private.read_handler_context,
                       "Sec-WebSocket-Key",0x11);
    UnityAssertEqualNumber
              (0,(long)cVar1,"on_header_field returned wrong value for sec_ws_key_field",0xb7,
               UNITY_DISPLAY_STYLE_INT);
    cVar1 = (*handler.http_location.on_header_field_name)
                      ((cio_http_client *)handler.websocket.ws_private.read_handler_context,
                       "dGhlIHNhbXBsZSBub25jZQ==",0x18);
    actual = (char *)(long)cVar1;
    UnityAssertEqualNumber
              (0,(UNITY_INT)actual,"on_header_value returned wrong value for sec_ws_key_value",0xb9,
               UNITY_DISPLAY_STYLE_INT);
    cVar1 = (*handler.http_location.on_header_field_value)
                      ((cio_http_client *)handler.websocket.ws_private.read_handler_context,actual,
                       extraout_RDX);
    UnityAssertEqualNumber
              ((long)iStack_30,(long)cVar1,"on_header_complete returned wrong value",0xbc,
               UNITY_DISPLAY_STYLE_INT);
    if (iStack_30 == 1) {
      UnityAssertEqualNumber
                (1,(ulong)fake_write_response_fake.call_count,"write_response was not called",0xbe,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (1,(ulong)on_connect_fake.call_count,"websocket on_connect was not called",0xbf,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (0x65,(ulong)fake_write_response_fake.arg1_val,
                 "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS",0xc0,
                 UNITY_DISPLAY_STYLE_INT);
    }
    setUp();
  }
  return;
}

Assistant:

static void test_ws_location_http_versions(void)
{
	struct upgrade_test {
		uint16_t major;
		uint16_t minor;
		enum cio_http_cb_return expected_ret_val;
	};

	struct upgrade_test tests[] = {
	    {.major = 1, .minor = 1, .expected_ret_val = CIO_HTTP_CB_SKIP_BODY},
	    {.major = 2, .minor = 0, .expected_ret_val = CIO_HTTP_CB_SKIP_BODY},
	    {.major = 1, .minor = 0, .expected_ret_val = CIO_HTTP_CB_ERROR},
	    {.major = 0, .minor = 9, .expected_ret_val = CIO_HTTP_CB_ERROR},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct upgrade_test test = tests[i];

		struct cio_websocket_location_handler handler;
		enum cio_error err = cio_websocket_location_handler_init(&handler, NULL, 0, on_connect, fake_handler_free);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "web socket handler initialization failed!");

		struct cio_http_client client;

		handler.websocket.ws_private.http_client = &client;
		handler.websocket.ws_private.http_client->current_handler = &handler.http_location;
		handler.websocket.ws_private.http_client->add_response_header = fake_add_response_header;
		handler.websocket.ws_private.http_client->write_response = fake_write_response;

		handler.websocket.ws_private.http_client->parser.upgrade = 1;
		handler.websocket.ws_private.http_client->http_method = CIO_HTTP_GET;
		handler.websocket.ws_private.http_client->http_major = test.major;
		handler.websocket.ws_private.http_client->http_minor = test.minor;

		static const char sec_ws_version_field[] = "Sec-WebSocket-Version";
		static const char sec_ws_version_value[] = "13";
		enum cio_http_cb_return cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_version_field, sizeof(sec_ws_version_field) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_version_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_version_value, sizeof(sec_ws_version_value) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_version_value");

		static const char sec_ws_key_field[] = "Sec-WebSocket-Key";
		static const char sec_ws_key_value[] = "dGhlIHNhbXBsZSBub25jZQ==";
		cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, sec_ws_key_field, sizeof(sec_ws_key_field) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_key_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, sec_ws_key_value, sizeof(sec_ws_key_value) - 1);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for sec_ws_key_value");

		cb_ret = handler.http_location.on_headers_complete(handler.websocket.ws_private.http_client);
		TEST_ASSERT_EQUAL_MESSAGE(test.expected_ret_val, cb_ret, "on_header_complete returned wrong value");
		if (test.expected_ret_val == CIO_HTTP_CB_SKIP_BODY) {
			TEST_ASSERT_EQUAL_MESSAGE(1, fake_write_response_fake.call_count, "write_response was not called");
			TEST_ASSERT_EQUAL_MESSAGE(1, on_connect_fake.call_count, "websocket on_connect was not called");
			TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_STATUS_SWITCHING_PROTOCOLS, fake_write_response_fake.arg1_val, "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS");
		}

		setUp();
	}
}